

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O0

void __thiscall Timidity::Renderer::finish_note(Renderer *this,int i)

{
  Voice *v_00;
  Voice *v;
  int i_local;
  Renderer *this_local;
  
  v_00 = this->voice + i;
  if ((v_00->status & 5) == 1) {
    v_00->status = v_00->status & 0xfd;
    v_00->status = v_00->status | 4;
    if ((v_00->sample->modes & 0x40) == 0) {
      v_00->status = v_00->status & 0xef;
    }
    Envelope::Release(&v_00->eg1,v_00);
    Envelope::Release(&v_00->eg2,v_00);
  }
  return;
}

Assistant:

void Renderer::finish_note(int i)
{
	Voice *v = &voice[i];

	if ((v->status & (VOICE_RUNNING | VOICE_RELEASING)) == VOICE_RUNNING)
	{
		v->status &= ~VOICE_SUSTAINING;
		v->status |= VOICE_RELEASING;

		if (!(v->sample->modes & PATCH_NO_SRELEASE))
		{
			v->status &= ~VOICE_LPE;	/* sampled release */
		}
		v->eg1.Release(v);
		v->eg2.Release(v);
	}
}